

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::Model::~Model(Model *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  ppPVar1 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar2 = (this->all_params).
                 super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1; ppPVar2 = ppPVar2 + 1
      ) {
    if (*ppPVar2 != (ParametersBase *)0x0) {
      (*(*ppPVar2)->_vptr_ParametersBase[5])();
    }
  }
  std::_Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::
  ~_Vector_base(&(this->lookup_params).
                 super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               );
  std::_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~_Vector_base
            (&(this->params).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>);
  std::_Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::~_Vector_base
            ((_Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)this);
  return;
}

Assistant:

Model::~Model() {
  for (auto p : all_params) delete p;
}